

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Err.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_10bd66::DefaultErrStreamBuf::overflow(DefaultErrStreamBuf *this,int character)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int in_ESI;
  long *in_RDI;
  int local_4;
  
  if (in_ESI != -1) {
    lVar2 = std::streambuf::pptr();
    lVar3 = std::streambuf::epptr();
    if (lVar2 != lVar3) {
      iVar1 = std::streambuf::sputc((char)in_RDI);
      return iVar1;
    }
  }
  if (in_ESI == -1) {
    local_4 = (**(code **)(*in_RDI + 0x30))();
  }
  else {
    (**(code **)(*in_RDI + 0x30))();
    local_4 = (**(code **)(*in_RDI + 0x68))(in_RDI,in_ESI);
  }
  return local_4;
}

Assistant:

virtual int overflow(int character)
    {
        if ((character != EOF) && (pptr() != epptr()))
        {
            // Valid character
            return sputc(static_cast<char>(character));
        }
        else if (character != EOF)
        {
            // Not enough space in the buffer: synchronize output and try again
            sync();
            return overflow(character);
        }
        else
        {
            // Invalid character: synchronize output
            return sync();
        }
    }